

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O3

size_t __thiscall proto2_unittest::TestMessageMapLite::ByteSizeLong(TestMessageMapLite *this)

{
  size_t sVar1;
  long *plVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  
  sVar3 = (size_t)*(uint *)&this->field_0;
  uVar4 = *(uint *)((long)&this->field_0 + 8);
  uVar5 = (ulong)uVar4;
  if (uVar4 != *(uint *)((long)&this->field_0 + 4)) {
    plVar2 = *(long **)(*(long *)((long)&this->field_0 + 0x10) + uVar5 * 8);
    if (plVar2 == (long *)0x0) {
      google::protobuf::internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
    do {
      do {
        sVar1 = google::protobuf::internal::
                MapEntryFuncs<int,_proto2_unittest::TestAllTypesLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                ::ByteSizeLong((int *)(plVar2 + 1),(TestAllTypesLite *)(plVar2 + 2));
        sVar3 = sVar3 + sVar1;
        plVar2 = (long *)*plVar2;
      } while (plVar2 != (long *)0x0);
      do {
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
        if (*(uint *)((long)&this->field_0 + 4) <= uVar4) goto LAB_001cfa90;
        plVar2 = *(long **)(*(long *)((long)&this->field_0 + 0x10) + (ulong)uVar4 * 8);
      } while (plVar2 == (long *)0x0);
    } while( true );
  }
LAB_001cfa90:
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar5 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar3 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar3;
  }
  return sVar3;
}

Assistant:

::size_t TestMessageMapLite::ByteSizeLong() const {
  const TestMessageMapLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestMessageMapLite)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<int32, .proto2_unittest.TestAllTypesLite> map_int32_message = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_message_size());
      for (const auto& entry : this_._internal_map_int32_message()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_unittest::TestAllTypesLite,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_MESSAGE>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}